

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

ClientHook * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::ensureAccepted
          (DeferredThirdPartyClient *this)

{
  uint uVar1;
  RpcConnectionState *vine;
  PointerReader *pPVar2;
  PointerReader contact;
  long *plVar3;
  ClientHook *pCVar4;
  undefined8 *local_58;
  long *plStack_50;
  undefined1 local_48 [24];
  BootstrapFactoryBase *pBStack_30;
  WirePointer *local_28;
  undefined8 uStack_20;
  
  uVar1 = (this->state).tag;
  if (uVar1 == 2) {
    pCVar4 = *(ClientHook **)((long)&(this->state).field_1 + 8);
  }
  else {
    if (uVar1 != 1) {
      kj::_::unreachable();
    }
    vine = (this->super_RpcClient).connectionState.ptr;
    pPVar2 = *(PointerReader **)((long)&(this->state).field_1 + 8);
    local_48._16_8_ = pPVar2->segment;
    pBStack_30 = (BootstrapFactoryBase *)pPVar2->capTable;
    local_28 = pPVar2->pointer;
    uStack_20 = *(undefined8 *)&pPVar2->nestingLimit;
    contact = *pPVar2;
    local_58 = *(undefined8 **)((long)&(this->state).field_1 + 0x10);
    plStack_50 = *(long **)((long)&(this->state).field_1 + 0x18);
    *(undefined8 *)((long)&(this->state).field_1 + 0x18) = 0;
    acceptThirdParty((RpcConnectionState *)local_48,(Reader)contact,
                     (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> *)
                     vine,SUB81(&local_58,0));
    if ((this->state).tag != 0) {
      kj::
      OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
      ::destroy(&this->state);
    }
    pCVar4 = (ClientHook *)local_48._8_8_;
    plVar3 = plStack_50;
    *(undefined8 *)&(this->state).field_1 = local_48._0_8_;
    *(undefined8 *)((long)&(this->state).field_1 + 8) = local_48._8_8_;
    local_48._8_8_ = (_func_int **)0x0;
    (this->state).tag = 2;
    if (plStack_50 != (long *)0x0) {
      plStack_50 = (long *)0x0;
      (**(code **)*local_58)(local_58,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  return pCVar4;
}

Assistant:

ClientHook& ensureAccepted() {
      // Call when this capability is actually used locally. If it's the first use, the Accept
      // message will be sent to actually accept it.

      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          return *state.init<kj::Own<ClientHook>>(
              connectionState->acceptThirdParty(
                  *deferred.contact, kj::mv(deferred.vine), needEmbargo));
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return *cap;
        }
      }
      KJ_UNREACHABLE;
    }